

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageSizeBase::SupportedInStage
          (ShaderImageSizeBase *this,int stage,int required)

{
  ostream *poVar1;
  bool bVar2;
  GLint imagesVS;
  ostringstream reason;
  int local_1bc;
  string local_1b8;
  ostringstream local_198 [376];
  
  switch(stage) {
  case 0:
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90ca,&local_1bc);
    bVar2 = required <= local_1bc;
    if (required <= local_1bc) {
      return bVar2;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"Required ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,required);
    poVar1 = std::operator<<(poVar1," VS image uniforms but only ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1bc);
    poVar1 = std::operator<<(poVar1," available.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    break;
  case 1:
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90cb,&local_1bc);
    bVar2 = required <= local_1bc;
    if (required <= local_1bc) {
      return bVar2;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"Required ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,required);
    poVar1 = std::operator<<(poVar1," TCS image uniforms but only ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1bc);
    poVar1 = std::operator<<(poVar1," available.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    break;
  case 2:
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90cc,&local_1bc);
    bVar2 = required <= local_1bc;
    if (required <= local_1bc) {
      return bVar2;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"Required ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,required);
    poVar1 = std::operator<<(poVar1," TES image uniforms but only ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1bc);
    poVar1 = std::operator<<(poVar1," available.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    break;
  case 3:
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90cd,&local_1bc);
    bVar2 = required <= local_1bc;
    if (required <= local_1bc) {
      return bVar2;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"Required ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,required);
    poVar1 = std::operator<<(poVar1," GS image uniforms but only ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1bc);
    poVar1 = std::operator<<(poVar1," available.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    break;
  default:
    return true;
  }
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return bVar2;
}

Assistant:

bool SupportedInStage(int stage, int required)
	{
		switch (stage)
		{
		case 0:
			return SupportedInVS(required);
		case 1:
			return SupportedInTCS(required);
		case 2:
			return SupportedInTES(required);
		case 3:
			return SupportedInGS(required);
		default:
			return true;
		}
	}